

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
Wrapper<CustomUintFormatter<8,false>,ServiceFlags_const&>::
Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
          (Wrapper<CustomUintFormatter<8,false>,ServiceFlags_const&> *this,
          ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s)

{
  HashedSourceWriter<AutoFile> *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = **(undefined8 **)this;
  this_00 = s->m_substream;
  AutoFile::write(this_00->m_source,(int)&local_20,&DAT_00000008,in_RCX);
  CSHA256::Write((CSHA256 *)this_00,(uchar *)&local_20,8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream &s) { Formatter().Unser(s, m_object); }